

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O3

void __thiscall TRM::Bitmap::BlendPixel(Bitmap *this,uint32_t x,uint32_t y,Color *pixel)

{
  Color CVar1;
  Color src;
  array<unsigned_char,_4UL> local_1c;
  
  if ((x < this->fWidth) && (y < this->fHeight)) {
    local_1c._M_elems =
         *&(this->fPixels).super__Vector_base<TRM::Color,_std::allocator<TRM::Color>_>._M_impl.
           super__Vector_impl_data._M_start[this->fWidth * y + x].fRGBA._M_elems;
    CVar1 = Color::blend((Color *)&local_1c,pixel);
    if ((x < this->fWidth) && (y < this->fHeight)) {
      *(array<unsigned_char,_4UL> *)
       (this->fPixels).super__Vector_base<TRM::Color,_std::allocator<TRM::Color>_>._M_impl.
       super__Vector_impl_data._M_start[this->fWidth * y + x].fRGBA._M_elems = CVar1.fRGBA._M_elems;
    }
  }
  return;
}

Assistant:

void Bitmap::BlendPixel(uint32_t x, uint32_t y, Color const &pixel) {
  if (x < 0 || x >= fWidth || y < 0 || y >= fHeight) {
    return;
  }

  auto src = this->GetPixel(x, y);

  auto result = src.blend(pixel);

  SetPixel(x, y, result);
}